

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O3

void __thiscall
xray_re::xr_ogf_v3::set_ext_geom(xr_ogf_v3 *this,xr_vbuf_vec *ext_vbufs,xr_ibuf_vec *ext_ibufs)

{
  pointer pxVar1;
  pointer pxVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (this->super_xr_ogf).m_loaded;
  if ((uVar3 >> 10 & 1) != 0) {
    uVar4 = (ulong)this->m_ext_vb_index;
    pxVar1 = (ext_vbufs->super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(ext_vbufs->
                   super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pxVar1 >> 4) * -0x3333333333333333;
    if (uVar5 < uVar4 || uVar5 - uVar4 == 0) goto LAB_0017d510;
    xr_vbuf::proxy(&(this->super_xr_ogf).m_vb,pxVar1 + uVar4,(ulong)this->m_ext_vb_offset,
                   (ulong)this->m_ext_vb_size);
    uVar3 = (this->super_xr_ogf).m_loaded;
  }
  if ((uVar3 >> 0x13 & 1) == 0) {
    return;
  }
  uVar4 = (ulong)this->m_ext_ib_index;
  pxVar2 = (ext_ibufs->super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(ext_ibufs->
                            super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>)
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pxVar2 >> 5)) {
    xr_ibuf::proxy(&(this->super_xr_ogf).m_ib,pxVar2 + uVar4,(ulong)this->m_ext_ib_offset,
                   (ulong)this->m_ext_ib_size);
    return;
  }
LAB_0017d510:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

void xr_ogf_v3::set_ext_geom(const xr_vbuf_vec& ext_vbufs, const xr_ibuf_vec& ext_ibufs)
{
	if (is_chunk_loaded(OGF3_VCONTAINER))
		m_vb.proxy(ext_vbufs.at(m_ext_vb_index), m_ext_vb_offset, m_ext_vb_size);
	if (is_chunk_loaded(OGF3_ICONTAINER))
		m_ib.proxy(ext_ibufs.at(m_ext_ib_index), m_ext_ib_offset, m_ext_ib_size);
}